

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS ref_geom_share_context(REF_GEOM ref_geom_recipient,REF_GEOM ref_geom_donor)

{
  undefined4 uVar1;
  undefined4 uVar2;
  void *pvVar3;
  REF_BOOL RVar4;
  uint uVar5;
  REF_INT *pRVar6;
  ulong uVar7;
  
  if ((ref_geom_recipient->contex_owned == 0) ||
     (uVar5 = ref_egads_close(ref_geom_recipient), uVar5 == 0)) {
    ref_geom_recipient->contex_owned = 0;
    ref_geom_recipient->nnode = ref_geom_donor->nnode;
    uVar1 = ref_geom_donor->nedge;
    uVar2 = ref_geom_donor->nface;
    ref_geom_recipient->nedge = uVar1;
    ref_geom_recipient->nface = uVar2;
    RVar4 = ref_geom_donor->effective_curvature;
    ref_geom_recipient->effective = ref_geom_donor->effective;
    ref_geom_recipient->effective_curvature = RVar4;
    ref_geom_recipient->manifold = ref_geom_donor->manifold;
    pvVar3 = ref_geom_donor->model;
    ref_geom_recipient->context = ref_geom_donor->context;
    ref_geom_recipient->model = pvVar3;
    pvVar3 = ref_geom_donor->faces;
    ref_geom_recipient->body = ref_geom_donor->body;
    ref_geom_recipient->faces = pvVar3;
    pvVar3 = ref_geom_donor->nodes;
    ref_geom_recipient->edges = ref_geom_donor->edges;
    ref_geom_recipient->nodes = pvVar3;
    ref_geom_recipient->pcurves = ref_geom_donor->pcurves;
    if (ref_geom_donor->e2f == (REF_INT *)0x0) {
      ref_geom_recipient->e2f = (REF_INT *)0x0;
      uVar5 = 0;
    }
    else if ((int)uVar1 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xd2,
             "ref_geom_share_context","malloc ref_geom_recipient->e2f of REF_INT negative");
      uVar5 = 1;
    }
    else {
      pRVar6 = (REF_INT *)malloc((ulong)(uint)(uVar1 * 2) * 4);
      ref_geom_recipient->e2f = pRVar6;
      if (pRVar6 == (REF_INT *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xd2
               ,"ref_geom_share_context","malloc ref_geom_recipient->e2f of REF_INT NULL");
        uVar5 = 2;
      }
      else {
        uVar5 = 0;
        for (uVar7 = 0; (uint)(uVar1 * 2) != uVar7; uVar7 = uVar7 + 1) {
          pRVar6[uVar7] = ref_geom_donor->e2f[uVar7];
        }
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xbd,
           "ref_geom_share_context",(ulong)uVar5,"close egads contex");
  }
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_geom_share_context(REF_GEOM ref_geom_recipient,
                                          REF_GEOM ref_geom_donor) {
  if (ref_geom_recipient->contex_owned)
    RSS(ref_egads_close(ref_geom_recipient), "close egads contex");

  ref_geom_recipient->contex_owned = REF_FALSE;
  ref_geom_recipient->nnode = ref_geom_donor->nnode;
  ref_geom_recipient->nedge = ref_geom_donor->nedge;
  ref_geom_recipient->nface = ref_geom_donor->nface;
  ref_geom_recipient->effective = ref_geom_donor->effective;
  ref_geom_recipient->effective_curvature = ref_geom_donor->effective_curvature;
  ref_geom_recipient->manifold = ref_geom_donor->manifold;
  ref_geom_recipient->context = ref_geom_donor->context;
  ref_geom_recipient->model = ref_geom_donor->model;
  ref_geom_recipient->body = ref_geom_donor->body;
  ref_geom_recipient->faces = ref_geom_donor->faces;
  ref_geom_recipient->edges = ref_geom_donor->edges;
  ref_geom_recipient->nodes = ref_geom_donor->nodes;
  ref_geom_recipient->pcurves = ref_geom_donor->pcurves;

  if (NULL == ref_geom_donor->e2f) {
    ref_geom_recipient->e2f = NULL;
  } else {
    REF_INT i;
    ref_malloc(ref_geom_recipient->e2f, 2 * ref_geom_recipient->nedge, REF_INT);
    for (i = 0; i < 2 * ref_geom_recipient->nedge; i++)
      ref_geom_recipient->e2f[i] = ref_geom_donor->e2f[i];
  }

  return REF_SUCCESS;
}